

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profile.hpp
# Opt level: O1

bool __thiscall
ruckig::Profile::
check_for_velocity<(ruckig::Profile::ControlSigns)1,(ruckig::Profile::ReachedLimits)7>
          (Profile *this,double jf,double aMax,double aMin)

{
  double dVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  dVar6 = (this->t)._M_elems[0];
  if (0.0 <= dVar6) {
    (this->t_sum)._M_elems[0] = dVar6;
    dVar6 = (this->t)._M_elems[1];
    bVar5 = true;
    if (0.0 <= dVar6) {
      uVar2 = 0;
      do {
        uVar4 = uVar2;
        (this->t_sum)._M_elems[uVar4 + 1] = dVar6 + (this->t_sum)._M_elems[uVar4];
        if (uVar4 == 5) break;
        dVar6 = (this->t)._M_elems[uVar4 + 2];
        uVar2 = uVar4 + 1;
      } while (0.0 <= dVar6);
      bVar5 = uVar4 < 5;
    }
    if ((!bVar5) && ((this->t_sum)._M_elems[6] <= 1000000000000.0)) {
      dVar6 = (this->t)._M_elems[2];
      dVar7 = (this->t)._M_elems[4];
      dVar8 = (this->t)._M_elems[6];
      (this->j)._M_elems[0] = (double)(-(ulong)(0.0 < (this->t)._M_elems[0]) & (ulong)jf);
      (this->j)._M_elems[1] = 0.0;
      (this->j)._M_elems[2] = (double)(-(ulong)(0.0 < dVar6) & (ulong)-jf);
      (this->j)._M_elems[3] = 0.0;
      (this->j)._M_elems[4] = (double)(-(ulong)(0.0 < dVar7) & (ulong)jf);
      (this->j)._M_elems[5] = 0.0;
      (this->j)._M_elems[6] = (double)(-(ulong)(0.0 < dVar8) & (ulong)-jf);
      dVar6 = (this->p)._M_elems[0];
      lVar3 = -0x38;
      dVar7 = (this->v)._M_elems[0];
      dVar8 = (this->a)._M_elems[0];
      do {
        dVar1 = *(double *)((long)(this->t_sum)._M_elems + lVar3);
        dVar9 = *(double *)((long)(this->a)._M_elems + lVar3) * dVar1;
        *(double *)((long)(this->v)._M_elems + lVar3) = dVar9 + dVar8;
        dVar10 = (dVar9 * 0.5 + dVar8) * dVar1 + dVar7;
        *(double *)((long)(this->p)._M_elems + lVar3) = dVar10;
        dVar6 = dVar6 + ((dVar9 / 6.0 + dVar8 * 0.5) * dVar1 + dVar7) * dVar1;
        *(double *)((long)(this->brake).t._M_elems + lVar3 + -8) = dVar6;
        lVar3 = lVar3 + 8;
        dVar7 = dVar10;
        dVar8 = dVar9 + dVar8;
      } while (lVar3 != 0);
      this->control_signs = UDUD;
      this->limits = NONE;
      this->direction = (uint)(aMax <= 0.0);
      dVar6 = aMax;
      if (0.0 < aMax) {
        dVar6 = aMin;
        aMin = aMax;
      }
      if ((ABS((this->v)._M_elems[7] - this->vf) < 1e-08) &&
         (ABS((this->a)._M_elems[7] - this->af) < 1e-10)) {
        dVar6 = dVar6 + -1e-12;
        dVar7 = (this->a)._M_elems[1];
        if ((dVar6 <= dVar7) && (dVar8 = (this->a)._M_elems[3], dVar6 <= dVar8)) {
          dVar9 = aMin + 1e-12;
          dVar1 = (this->a)._M_elems[5];
          return (bool)((dVar1 <= dVar9 && dVar6 <= dVar1) & -(dVar7 <= dVar9) & -(dVar8 <= dVar9));
        }
      }
    }
  }
  return false;
}

Assistant:

bool check_for_velocity(double jf, double aMax, double aMin) {
        if (t[0] < 0) {
            return false;
        }

        t_sum[0] = t[0];
        for (size_t i = 0; i < 6; ++i) {
            if (t[i+1] < 0) {
                return false;
            }

            t_sum[i+1] = t_sum[i] + t[i+1];
        }

        if constexpr (limits == ReachedLimits::ACC0) {
            if (t[1] < std::numeric_limits<double>::epsilon()) {
                return false;
            }
        }

        if (t_sum.back() > t_max) { // For numerical reasons, is that needed?
            return false;
        }

        if constexpr (control_signs == ControlSigns::UDDU) {
            j = {(t[0] > 0 ? jf : 0), 0, (t[2] > 0 ? -jf : 0), 0, (t[4] > 0 ? -jf : 0), 0, (t[6] > 0 ? jf : 0)};
        } else {
            j = {(t[0] > 0 ? jf : 0), 0, (t[2] > 0 ? -jf : 0), 0, (t[4] > 0 ? jf : 0), 0, (t[6] > 0 ? -jf : 0)};
        }

        for (size_t i = 0; i < 7; ++i) {
            a[i+1] = a[i] + t[i] * j[i];
            v[i+1] = v[i] + t[i] * (a[i] + t[i] * j[i] / 2);
            p[i+1] = p[i] + t[i] * (v[i] + t[i] * (a[i] / 2 + t[i] * j[i] / 6));
        }

        this->control_signs = control_signs;
        this->limits = limits;

        direction = (aMax > 0) ? Profile::Direction::UP : Profile::Direction::DOWN;
        const double aUppLim = (direction == Profile::Direction::UP ? aMax : aMin) + a_eps;
        const double aLowLim = (direction == Profile::Direction::UP ? aMin : aMax) - a_eps;

        // Velocity limit can be broken in the beginning if both initial velocity and acceleration are too high
        // std::cout << std::setprecision(15) << "target: " << std::abs(p.back() - pf) << " " << std::abs(v.back() - vf) << " " << std::abs(a.back() - af) << " T: " << t_sum.back() << " " << to_string() << std::endl;
        return std::abs(v.back() - vf) < v_precision && std::abs(a.back() - af) < a_precision
            && a[1] >= aLowLim && a[3] >= aLowLim && a[5] >= aLowLim
            && a[1] <= aUppLim && a[3] <= aUppLim && a[5] <= aUppLim;
    }